

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void clear_save_pos_for_undo_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  undefined1 local_40 [8];
  Am_Value value;
  Am_Object local_20;
  Am_Object parent;
  Am_Object obj;
  Am_Object *command_obj_local;
  
  Am_Object::Am_Object(&parent);
  Am_Object::Am_Object(&local_20);
  Am_Value::Am_Value((Am_Value *)local_40);
  Am_Object::operator=(&parent,command_obj);
  do {
    in_value = Am_Object::Peek(&parent,0x154,0);
    Am_Value::operator=((Am_Value *)local_40,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_40);
    if (!bVar1) {
LAB_00330ada:
      Am_Value::~Am_Value((Am_Value *)local_40);
      Am_Object::~Am_Object(&local_20);
      Am_Object::~Am_Object(&parent);
      return;
    }
    if (local_40._0_2_ != 0xa001) {
      bVar1 = Am_Value::operator==((Am_Value *)local_40,-2);
      if (bVar1) {
        Am_Object::Set(&parent,0x154,0,0);
      }
      goto LAB_00330ada;
    }
    Am_Object::operator=(&parent,(Am_Value *)local_40);
  } while( true );
}

Assistant:

Am_Define_Method_No_Static(Am_Object_Method, void, clear_save_pos_for_undo,
                           (Am_Object command_obj))
{
  Am_Object obj, parent;
  Am_Value value;
  obj = command_obj;
  while (true) {
    value = obj.Peek(Am_IMPLEMENTATION_PARENT);
    if (value.Valid()) {
      if (value.type != Am_OBJECT) {
        if (value == Am_MARKER_FOR_SCROLL_INC)
          obj.Set(Am_IMPLEMENTATION_PARENT, 0);
        break;
      }
    } else { // not valid
      break;
    }
    obj = value;
  }
}